

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenu::mousePressEvent(QMenu *this,QMouseEvent *e)

{
  QMenuPrivate *this_00;
  undefined1 auVar1 [16];
  bool bVar2;
  char cVar3;
  QPoint QVar4;
  QAction *action;
  QSize QVar5;
  long in_FS_OFFSET;
  QPointF QVar6;
  QPointF local_88;
  QPoint local_78;
  QPointF local_70;
  QPoint local_60;
  QRect local_58;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  if ((this_00->field_0x421 & 1) != 0) goto LAB_004257d8;
  bVar2 = QMenuPrivate::mouseEventTaken(this_00,e);
  if (bVar2) goto LAB_004257d8;
  local_48 = QSinglePointEvent::position((QSinglePointEvent *)e);
  QVar4 = QPointF::toPoint(&local_48);
  if (QVar4 == (QPoint)0x0) {
    QVar6 = QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
    if ((((QVar6.xp == 0.0) && (!NAN(QVar6.xp))) && (QVar6.yp == 0.0)) && (!NAN(QVar6.yp)))
    goto LAB_00425643;
  }
  else {
LAB_00425643:
    local_58 = QWidget::rect(&this->super_QWidget);
    local_70 = QSinglePointEvent::position((QSinglePointEvent *)e);
    local_60 = QPointF::toPoint(&local_70);
    cVar3 = QRect::contains((QPoint *)&local_58,SUB81(&local_60,0));
    if (cVar3 != '\0') {
      local_88 = QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
      local_78 = QPointF::toPoint(&local_88);
      bVar2 = QMenuPrivate::hasMouseMoved(this_00,&local_78);
      if (bVar2) {
        QMenuPrivate::mouseDown = this;
        local_48 = QSinglePointEvent::position((QSinglePointEvent *)e);
        QVar4 = QPointF::toPoint(&local_48);
        action = QMenuPrivate::actionAt(this_00,QVar4);
        QMenuPrivate::setCurrentAction(this_00,action,0x14,SelectedFromElsewhere,false);
        QWidget::update(&this->super_QWidget);
        goto LAB_004257d8;
      }
    }
  }
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this_00->noReplayFor);
  if (bVar2) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_70.yp;
    local_70 = (QPointF)(auVar1 << 0x40);
    QVar4 = QWidget::mapToGlobal((QWidget *)(this_00->noReplayFor).wp.value,(QPoint *)&local_70);
    QVar5 = QWidget::size((QWidget *)(this_00->noReplayFor).wp.value);
    local_48.yp._0_4_ = QVar4.xp.m_i.m_i + QVar5.wd.m_i.m_i + -1;
    local_48.xp = (qreal)QVar4;
    local_48.yp._4_4_ = QVar5.ht.m_i.m_i + QVar4.yp.m_i.m_i + -1;
    local_58 = (QRect)QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
    QVar4 = QPointF::toPoint((QPointF *)&local_58);
    local_88.xp = (qreal)QVar4;
    cVar3 = QRect::contains((QPoint *)&local_48,SUB81(&local_88,0));
    if (cVar3 != '\0') {
      QWidget::setAttribute(&this->super_QWidget,WA_NoMouseReplay,true);
    }
  }
  if (this_00->eventLoop != (QEventLoop *)0x0) {
    QWeakPointer<QObject>::assign<QObject>(&(this_00->syncAction).wp,(QObject *)0x0);
  }
  QMenuPrivate::hideUpToMenuBar(this_00);
LAB_004257d8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::mousePressEvent(QMouseEvent *e)
{
    Q_D(QMenu);
    if (d->aboutToHide || d->mouseEventTaken(e))
        return;
    // Workaround for XCB on multiple screens which doesn't have offset. If the menu is open on one screen
    // and mouse clicks on second screen, e->pos() is QPoint(0,0) and the menu doesn't hide. This trick makes
    // possible to hide the menu when mouse clicks on another screen (e->screenPos() returns correct value).
    // Only when mouse clicks in QPoint(0,0) on second screen, the menu doesn't hide.
    if ((e->position().toPoint().isNull() && !e->globalPosition().isNull())
        || !rect().contains(e->position().toPoint())
        || !d->hasMouseMoved(e->globalPosition().toPoint())) {
         if (d->noReplayFor
             && QRect(d->noReplayFor->mapToGlobal(QPoint()), d->noReplayFor->size()).contains(e->globalPosition().toPoint()))
             setAttribute(Qt::WA_NoMouseReplay);
         if (d->eventLoop) // synchronous operation
             d->syncAction = nullptr;
        d->hideUpToMenuBar();
        return;
    }
    QMenuPrivate::mouseDown = this;

    QAction *action = d->actionAt(e->position().toPoint());
    d->setCurrentAction(action, 20);
    update();
}